

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O1

void Handler_gibhealth_I_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int iVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  bool bVar4;
  
  pPVar2 = PClassActor::RegistrationInfo.MyClass;
  iVar1 = params[1].i;
  if (*(PClass **)
       ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
               super_PCompoundType.super_PType.super_PTypeBase + 8) == (PClass *)0x0) {
    pPVar3 = (PClass *)
             (*(code *)**(undefined8 **)
                         &(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.super_PTypeBase)(info);
    *(PClass **)
     ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
             super_PCompoundType.super_PType.super_PTypeBase + 8) = pPVar3;
  }
  pPVar3 = *(PClass **)
            ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.super_PTypeBase + 8);
  bVar4 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar2 && bVar4) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar4 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar2) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (bVar4) {
    info->GibHealth = iVar1;
    return;
  }
  __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassActor))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                ,0x240,
                "void Handler_gibhealth_I_Actor(AActor *, PClassActor *, Baggage &, FPropParam *)");
}

Assistant:

DEFINE_PROPERTY(gibhealth, I, Actor)
{
	PROP_INT_PARM(id, 0);
	assert(info->IsKindOf(RUNTIME_CLASS(PClassActor)));
	static_cast<PClassActor *>(info)->GibHealth = id;
}